

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestResult *in_RSI;
  string *in_RDI;
  size_t in_stack_fffffffffffffa78;
  string *width;
  allocator<char> *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_fffffffffffffb28;
  undefined1 uVar2;
  string *in_stack_fffffffffffffb30;
  string *indent;
  string *in_stack_fffffffffffffb38;
  string *value;
  string *name;
  string *psVar3;
  string *stream_00;
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  TimeInMillis in_stack_fffffffffffffbf8;
  undefined1 local_3e1 [40];
  allocator<char> local_3b9;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [8];
  TimeInMillis in_stack_fffffffffffffcb8;
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [32];
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  undefined1 local_f9 [33];
  TestResult *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  undefined1 local_b1 [40];
  undefined1 local_89 [40];
  allocator<char> local_61;
  string local_60 [48];
  string local_30 [32];
  TestResult *local_10;
  string *local_8;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffb28 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  Indent_abi_cxx11_(in_stack_fffffffffffffa78);
  poVar1 = std::operator<<((ostream *)in_RDI,local_30);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string(local_30);
  stream_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  psVar3 = (string *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  name = (string *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  Indent_abi_cxx11_(in_stack_fffffffffffffa78);
  OutputJsonKey((ostream *)stream_00,psVar3,name,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30
                ,(bool)uVar2);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  value = (string *)local_f9;
  indent = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  uVar2 = (undefined1)((ulong)&local_121 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
  Indent_abi_cxx11_(in_stack_fffffffffffffa78);
  OutputJsonKey((ostream *)stream_00,psVar3,name,(int)((ulong)value >> 0x20),indent,(bool)uVar2);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,(int)((ulong)value >> 0x20),indent,(bool)uVar2);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,(int)((ulong)value >> 0x20),indent,(bool)uVar2);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,(int)((ulong)value >> 0x20),indent,(bool)uVar2);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,(int)((ulong)value >> 0x20),indent,(bool)uVar2);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    TestResult::elapsed_time(local_10);
    FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffbf8);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,value,indent,(bool)uVar2);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::~allocator(&local_351);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator(&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    TestResult::start_timestamp(local_10);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffffcb8);
    Indent_abi_cxx11_(in_stack_fffffffffffffa78);
    OutputJsonKey((ostream *)stream_00,psVar3,name,value,indent,(bool)uVar2);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf8);
    std::__cxx11::string::~string((string *)(local_3e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3e1);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  psVar3 = local_8;
  width = local_448;
  Indent_abi_cxx11_((size_t)width);
  poVar1 = std::operator<<((ostream *)psVar3,width);
  std::operator<<(poVar1,"\"testsuite\": [\n");
  std::__cxx11::string::~string(local_448);
  OutputJsonTestCaseForTestResult(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<((ostream *)local_8,"\n");
  Indent_abi_cxx11_((size_t)width);
  poVar1 = std::operator<<(poVar1,local_468);
  poVar1 = std::operator<<(poVar1,"]\n");
  Indent_abi_cxx11_((size_t)width);
  poVar1 = std::operator<<(poVar1,local_488);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string(local_488);
  std::__cxx11::string::~string(local_468);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  OutputJsonTestCaseForTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}